

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O1

void __thiscall
chrono::ChArchiveOutJSON::out_ref
          (ChArchiveOutJSON *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  undefined1 *puVar1;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *this_00;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  _Elt_pointer pbVar4;
  ChStreamOutAscii *pCVar5;
  _Elt_pointer piVar6;
  undefined3 in_register_00000011;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_01;
  undefined4 uVar7;
  bool local_61;
  size_t local_60;
  undefined4 local_58;
  int local_54;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *local_50;
  char *local_48;
  size_t local_40;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *local_38;
  
  local_60 = obj_ID;
  local_40 = ext_ID;
  iVar3 = (*bVal->_vptr_ChValue[3])(bVal);
  local_48 = *(char **)CONCAT44(extraout_var,iVar3);
  comma_cr(this);
  pbVar4 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
  }
  if (pbVar4[-1] == false) {
    if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
      iVar3 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
    }
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,(bVal->_name)._M_dataplus._M_p);
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar5,"\t: \n");
  }
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar3 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"{ ");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  local_50 = &this->nitems;
  local_54 = 0;
  piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>(&local_50->c,&local_54);
  }
  else {
    *piVar6 = 0;
    (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar6 + 1;
  }
  this_00 = &this->is_array;
  local_61 = false;
  pbVar4 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<bool,_std::allocator<bool>_>::_M_push_back_aux<bool>(&this_00->c,&local_61);
  }
  else {
    *pbVar4 = false;
    (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data
    ._M_finish._M_cur = pbVar4 + 1;
  }
  uVar7 = CONCAT31(in_register_00000011,already_inserted);
  if (*local_48 != '\0') {
    local_58 = CONCAT31(in_register_00000011,already_inserted);
    comma_cr(this);
    if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
      iVar3 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
    }
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_type\"\t: ");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"\"");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,local_48);
    chrono::ChStreamOutAscii::operator<<(pCVar5,"\"");
    piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar6[-1] = piVar6[-1] + 1;
    uVar7 = local_58;
  }
  local_38 = this_00;
  if ((char)uVar7 == '\0') {
    comma_cr(this);
    if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
      iVar3 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
    }
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_object_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar5,local_60);
    piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar6[-1] = piVar6[-1] + 1;
    (*bVal->_vptr_ChValue[0xe])(bVal,this);
    (*bVal->_vptr_ChValue[0xd])(bVal,this);
    this_01 = local_50;
    goto LAB_001298b7;
  }
  if (local_60 == 0) {
    iVar3 = (*bVal->_vptr_ChValue[7])(bVal);
    if ((char)iVar3 != '\0') goto LAB_001296f6;
  }
  else {
LAB_001296f6:
    comma_cr(this);
    if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
      iVar3 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
    }
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_reference_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar5,local_60);
    piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar6[-1] = piVar6[-1] + 1;
  }
  sVar2 = local_40;
  this_01 = local_50;
  if (local_40 != 0) {
    comma_cr(this);
    if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
      iVar3 = 0;
      do {
        chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
        iVar3 = iVar3 + 1;
      } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
    }
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_external_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar5,sVar2);
    piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar6[-1] = piVar6[-1] + 1;
  }
LAB_001298b7:
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  std::deque<int,_std::allocator<int>_>::pop_back(&this_01->c);
  std::deque<bool,_std::allocator<bool>_>::pop_back(&local_38->c);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\n");
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar3 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"}");
  piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar6 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar6 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  piVar6[-1] = piVar6[-1] + 1;
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID)  {
          const char* classname = bVal.GetClassRegisteredName().c_str();
          comma_cr();
		  if (is_array.top() == false) {
			  indent();
			  (*ostream) << "\"" << bVal.name() << "\"" << "\t: \n";
		  }
          indent();
          (*ostream) << "{ ";
          
          ++tablevel;
          nitems.push(0);
          is_array.push(false);

          if(strlen(classname)>0) {
              comma_cr();
              indent();
              (*ostream) << "\"_type\"\t: "  << "\"" << classname << "\"";
              ++nitems.top();
          }
          
          if (!already_inserted) {
            comma_cr();
            indent();
            (*ostream) << "\"_object_ID\"\t: "  << obj_ID;
            ++nitems.top();
          
            // New Object, we have to full serialize it
            bVal.CallArchiveOutConstructor(*this);
            bVal.CallArchiveOut(*this);
          } else {
              if (obj_ID || bVal.IsNull() ) {
                comma_cr();
                indent();
                (*ostream) << "\"_reference_ID\"\t: "  << obj_ID;
                ++nitems.top();
              }
              if (ext_ID) {
                comma_cr();
                indent();
                (*ostream) << "\"_external_ID\"\t: "  << ext_ID;
                ++nitems.top();
              }
          }
          --tablevel;
          nitems.pop();
          is_array.pop();

          (*ostream) << "\n";
          indent();
          (*ostream) << "}";
          ++nitems.top();
      }